

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall LFPConsumer::initialize(LFPConsumer *this)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  reference pvVar4;
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000028;
  vector<int,_std::allocator<int>_> *in_stack_00000030;
  int i;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int prev;
  vector<int,_std::allocator<int>_> newindices;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff90;
  HFSubConsumer *this_00;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  vector<short,_std::allocator<short>_> *in_stack_ffffffffffffffb0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  pointer *local_30;
  int local_24;
  
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1cd80d);
  local_24 = -2;
  local_30 = &in_RDI[0x28].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_38._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff88);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff90,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff88);
    if (!bVar2) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_38);
    iVar1 = *piVar3;
    if (iVar1 - local_24 == 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::back(in_stack_ffffffffffffff90);
      *pvVar4 = *pvVar4 + 1;
    }
    else {
      std::vector<int,_std::allocator<int>_>::push_back
                (in_RDI,(value_type_conflict *)
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      in_stack_ffffffffffffffa8 = 1;
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_ffffffffffffff90,(value_type_conflict *)in_stack_ffffffffffffff88);
    }
    local_24 = iVar1;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_38);
  }
  std::vector<int,_std::allocator<int>_>::operator=(in_stack_00000030,in_stack_00000028);
  this_00 = (HFSubConsumer *)(in_RDI + 0x2b);
  HighFreqDataType::getByteSize
            ((HighFreqDataType *)
             &(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish);
  std::vector<short,_std::allocator<short>_>::resize
            (in_stack_ffffffffffffffb0,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
            );
  HFSubConsumer::initialize(this_00);
  std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
  return;
}

Assistant:

void LFPConsumer::initialize(){
    //indices are list of indices for each ntrode requested
    //Here, convert into {startbyte, len} so that nearby indices are collapsed
    std::vector<int> newindices;
    int prev = -2;
    for(auto const i : args.indices){
        if(i-prev == 1){//If i is right after the previous index
            newindices.back()++;
        }
        else{//else its a new separate grouping
            newindices.push_back(i);
            newindices.push_back(1);
        }
        prev = i;
    }
    // for(auto const i : newindices) std::cout << "-i" << i;
    // std::cout << std::endl;
    args.indices = newindices;
    // std::cout << std::endl;
    temp.resize(dt.getByteSize()/sizeof(int16_t));
    HFSubConsumer::initialize();
}